

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qetag.c
# Opt level: O0

Qiniu_Error Qiniu_Qetag_New(_Qiniu_Qetag_Context **ctx,uint concurrency)

{
  _Qiniu_Qetag_Context *ctx_00;
  Qiniu_Error QVar1;
  Qiniu_Qetag_Context *newCtx;
  uint concurrency_local;
  _Qiniu_Qetag_Context **ctx_local;
  Qiniu_Error err;
  
  if (concurrency == 0) {
    newCtx._4_4_ = 1;
  }
  else {
    newCtx._4_4_ = concurrency;
    if (0x10 < concurrency) {
      newCtx._4_4_ = 0x10;
    }
  }
  ctx_00 = (_Qiniu_Qetag_Context *)calloc(1,(ulong)(newCtx._4_4_ - 1) * 0x10 + 0x30);
  if (ctx_00 == (_Qiniu_Qetag_Context *)0x0) {
    ctx_local = (_Qiniu_Qetag_Context **)0x270f;
    err._0_8_ = anon_var_dwarf_baa9;
  }
  else {
    ctx_00->blkElementCount = (unsigned_short)newCtx._4_4_;
    QVar1 = Qiniu_Qetag_Reset(ctx_00);
    err._0_8_ = QVar1.message;
    ctx_local = (_Qiniu_Qetag_Context **)(ulong)(uint)QVar1.code;
    if (QVar1.code == 200) {
      *ctx = ctx_00;
      ctx_local = (_Qiniu_Qetag_Context **)0xc8;
      err._0_8_ = anon_var_dwarf_bac7;
    }
    else {
      Qiniu_Qetag_Destroy(ctx_00);
    }
  }
  QVar1.message = (char *)err._0_8_;
  QVar1._0_8_ = ctx_local;
  return QVar1;
}

Assistant:

Qiniu_Error Qiniu_Qetag_New(struct _Qiniu_Qetag_Context ** ctx, unsigned int concurrency)
{
    Qiniu_Error err;
    Qiniu_Qetag_Context * newCtx = NULL;

    // 分配主结构体
    if (concurrency < 1) {
        concurrency = 1;
    } else if (concurrency > BLOCK_ELEMENT_MAX_COUNT) {
        concurrency = BLOCK_ELEMENT_MAX_COUNT;
    } // if

    newCtx = calloc(1, sizeof(*newCtx) + sizeof(newCtx->blkArray[0]) * (concurrency - 1));
    if (newCtx == NULL) {
        err.code = 9999;
        err.message = "not enough memory";
        return err;
    }
    newCtx->blkElementCount = concurrency;

    err = Qiniu_Qetag_Reset(newCtx);
    if (err.code != 200) {
        Qiniu_Qetag_Destroy(newCtx);
        return err;
    }

    *ctx = newCtx;
    err.code = 200;
    err.message = "ok";
    return err;
}